

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::fence_sync(NegativeTestContext *ctx)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_ENUM is generated if condition is not GL_SYNC_GPU_COMMANDS_COMPLETE.",
             &local_29);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0xffffffff,0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"GL_INVALID_VALUE is generated if flags is not zero.",&local_29);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0x10);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void fence_sync (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if condition is not GL_SYNC_GPU_COMMANDS_COMPLETE.");
	ctx.glFenceSync(-1, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if flags is not zero.");
	ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0x0010);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}